

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,ImS64 *p_scroll_v,
                       ImS64 size_avail_v,ImS64 size_contents_v,ImDrawFlags flags)

{
  ImGuiWindow *pIVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [16];
  bool bVar4;
  ImGuiContext *pIVar5;
  ImU32 col;
  ImGuiCol idx;
  long lVar6;
  uint uVar7;
  float fVar8;
  int iVar9;
  undefined1 auVar10 [12];
  float fVar15;
  int iVar16;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined4 in_XMM5_Db;
  undefined4 in_XMM5_Dc;
  undefined4 in_XMM5_Dd;
  bool local_de;
  bool local_dd;
  float local_dc;
  ImRect local_d8;
  ImGuiAxis local_c4;
  long *local_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImVec2 local_40;
  ImVec2 local_38;
  undefined1 auVar13 [16];
  undefined1 auVar19 [16];
  
  pIVar5 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    fVar8 = (bb_frame->Max).x - (bb_frame->Min).x;
    fVar15 = (bb_frame->Max).y - (bb_frame->Min).y;
    local_de = false;
    if ((0.0 < fVar8) && (0.0 < fVar15)) {
      local_dc = 1.0;
      if (axis == ImGuiAxis_Y) {
        fVar21 = (GImGui->Style).FramePadding.y;
        fVar21 = fVar21 + fVar21;
        if (fVar15 < fVar21 + GImGui->FontSize) {
          fVar21 = (fVar15 - GImGui->FontSize) / fVar21;
          if (fVar21 < 0.0) {
            return false;
          }
          local_dc = 1.0;
          if (fVar21 <= 1.0) {
            local_dc = fVar21;
          }
          if (local_dc <= 0.0) {
            return false;
          }
        }
      }
      iVar9 = (int)((fVar8 + -2.0) * 0.5);
      iVar16 = (int)((fVar15 + -2.0) * 0.5);
      auVar22._0_4_ = -(uint)(iVar9 < 0);
      auVar22._4_4_ = -(uint)(iVar16 < 0);
      auVar22._8_8_ = 0;
      auVar11._0_4_ = -(uint)(3 < iVar9);
      auVar11._4_4_ = -(uint)(3 < iVar16);
      auVar11._8_8_ = 0;
      auVar23._8_4_ = 0x80000000;
      auVar23._0_8_ = CONCAT44((float)iVar16,(float)iVar9) ^ 0x8000000080000000;
      auVar23._12_4_ = 0x80000000;
      auVar23 = auVar22 & _DAT_001920b0 | ~auVar22 & (auVar11 & _DAT_001920a0 | ~auVar11 & auVar23);
      fStack_b0 = auVar23._0_4_;
      fVar15 = auVar23._4_4_;
      auVar17._0_8_ = auVar23._0_8_;
      auVar17._8_4_ = fStack_b0;
      auVar17._12_4_ = fVar15;
      local_d8.Min.x = (bb_frame->Min).x;
      local_d8.Min.y = (bb_frame->Min).y;
      local_d8.Max.x = (bb_frame->Max).x;
      local_d8.Max.y = (bb_frame->Max).y;
      local_b8 = local_d8.Min.x - fStack_b0;
      fVar8 = local_d8.Min.y - fVar15;
      fStack_b0 = local_d8.Max.x + fStack_b0;
      fStack_b4 = local_d8.Max.y + fVar15;
      auVar2._4_8_ = auVar17._8_8_;
      auVar2._0_4_ = local_d8.Min.y + fVar15;
      auVar18._0_8_ = auVar2._0_8_ << 0x20;
      auVar18._8_4_ = fStack_b0;
      auVar18._12_4_ = fStack_b4;
      local_d8.Max = auVar18._8_8_;
      local_d8.Min.y = fVar8;
      local_d8.Min.x = local_b8;
      if (axis != ImGuiAxis_X) {
        fStack_b0 = fStack_b4;
        local_b8 = fVar8;
      }
      local_b8 = fStack_b0 - local_b8;
      lVar6 = size_contents_v - size_avail_v;
      if (lVar6 == 0 || size_contents_v < size_avail_v) {
        size_contents_v = size_avail_v;
      }
      if (size_contents_v < 2) {
        size_contents_v = 1;
      }
      fVar21 = ((float)size_avail_v / (float)size_contents_v) * local_b8;
      fVar8 = (GImGui->Style).GrabMinSize;
      fVar15 = local_b8;
      if (fVar21 <= local_b8) {
        fVar15 = fVar21;
      }
      uVar7 = -(uint)(fVar21 < fVar8);
      local_98 = (float)(uVar7 & (uint)fVar8 | ~uVar7 & (uint)fVar15);
      local_de = false;
      local_dd = false;
      local_c4 = axis;
      local_c0 = p_scroll_v;
      fStack_ac = fStack_b4;
      fStack_94 = fStack_b4;
      fStack_90 = fStack_b0;
      fStack_8c = fStack_b4;
      ButtonBehavior(&local_d8,id,&local_dd,&local_de,0x40000);
      auVar3._8_4_ = fStack_b0;
      auVar3._0_8_ = CONCAT44(fStack_b4,local_b8);
      auVar3._12_4_ = fStack_ac;
      if (lVar6 < 2) {
        lVar6 = 1;
      }
      auVar24._4_4_ = (float)*local_c0;
      auVar24._0_4_ = local_98;
      auVar24._8_4_ = fStack_94;
      auVar24._12_4_ = 0;
      auVar13._8_4_ = fStack_b4;
      auVar13._0_8_ = CONCAT44(fStack_b4,local_b8);
      auVar13._12_4_ = in_XMM5_Db;
      auVar12._8_8_ = auVar13._8_8_;
      auVar12._4_4_ = (float)lVar6;
      auVar12._0_4_ = local_b8;
      auVar23 = divps(auVar24,auVar12);
      fVar15 = auVar23._4_4_;
      iVar9 = -(uint)(auVar23._0_4_ < 1.0);
      iVar16 = -(uint)(fVar15 < 0.0);
      auVar20._4_4_ = iVar16;
      auVar20._0_4_ = iVar9;
      auVar20._8_4_ = iVar16;
      auVar20._12_4_ = iVar16;
      auVar19._8_8_ = auVar20._8_8_;
      auVar19._4_4_ = iVar9;
      auVar19._0_4_ = iVar9;
      uVar7 = movmskpd((int)local_c0,auVar19);
      fVar8 = 0.0;
      if (((uVar7 & 2) == 0) && (fVar8 = 1.0, fVar15 <= 1.0)) {
        fVar8 = fVar15;
      }
      auVar14._4_12_ = auVar3._4_12_;
      auVar14._0_4_ = local_b8 - local_98;
      local_a8 = (fVar8 * auVar14._0_4_) / local_b8;
      uStack_a4 = 0;
      uStack_a0 = 0;
      uStack_9c = 0;
      if (((1.0 <= local_dc) && ((uVar7 & 1) != 0)) && (local_de != false)) {
        local_58 = auVar14;
        local_78 = (float)lVar6;
        uStack_74 = in_XMM5_Db;
        uStack_70 = in_XMM5_Dc;
        uStack_6c = in_XMM5_Dd;
        local_68 = auVar23;
        fVar8 = (*(float *)((pIVar5->IO).MouseDown + (long)local_c4 * 4 + -8) -
                (&local_d8.Min.x)[local_c4]) / local_b8;
        auVar10 = ZEXT812(0x3f800000);
        if (fVar8 <= 1.0) {
          auVar10._4_8_ = 0;
          auVar10._0_4_ = fVar8;
        }
        local_88._4_4_ = 0;
        local_88._0_4_ = ~-(uint)(fVar8 < 0.0) & auVar10._0_4_;
        local_88._8_4_ = auVar10._8_4_;
        local_88._12_4_ = 0;
        SetHoveredID(id);
        if (pIVar5->ActiveIdIsJustActivated == false) {
          fVar8 = pIVar5->ScrollbarClickDeltaToGrabCenter;
          bVar4 = false;
        }
        else if (((float)local_88._0_4_ < local_a8) ||
                ((float)local_68._0_4_ + local_a8 < (float)local_88._0_4_)) {
          pIVar5->ScrollbarClickDeltaToGrabCenter = 0.0;
          bVar4 = true;
          fVar8 = 0.0;
        }
        else {
          fVar8 = (float)local_68._0_4_ * -0.5 + ((float)local_88._0_4_ - local_a8);
          pIVar5->ScrollbarClickDeltaToGrabCenter = fVar8;
          bVar4 = false;
        }
        fVar15 = ((float)local_68._0_4_ * -0.5 + ((float)local_88._0_4_ - fVar8)) /
                 (1.0 - (float)local_68._0_4_);
        fVar8 = 1.0;
        if (fVar15 <= 1.0) {
          fVar8 = fVar15;
        }
        lVar6 = (long)((float)(~-(uint)(fVar15 < 0.0) & (uint)fVar8) * local_78);
        *local_c0 = lVar6;
        fVar15 = (float)lVar6 / local_78;
        fVar8 = 1.0;
        if (fVar15 <= 1.0) {
          fVar8 = fVar15;
        }
        local_a8 = ((float)local_58._0_4_ * (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar8)) /
                   local_b8;
        uStack_a4 = local_58._4_4_;
        uStack_a0 = local_58._8_4_;
        uStack_9c = local_58._12_4_;
        if (bVar4) {
          pIVar5->ScrollbarClickDeltaToGrabCenter =
               -(float)local_68._0_4_ * 0.5 + ((float)local_88._0_4_ - local_a8);
        }
      }
      col = GetColorU32(0xe,1.0);
      idx = 0x11;
      if (local_de == false) {
        idx = (local_dd & 1) + 0xf;
      }
      local_dc = (float)GetColorU32(idx,local_dc);
      ImDrawList::AddRectFilled
                (pIVar1->DrawList,&bb_frame->Min,&bb_frame->Max,col,pIVar1->WindowRounding,flags);
      if (local_c4 == ImGuiAxis_X) {
        local_40.x = local_d8.Min.x + (local_d8.Max.x - local_d8.Min.x) * local_a8;
        local_38.x = local_98 + local_40.x;
        local_38.y = local_d8.Max.y;
        local_40.y = local_d8.Min.y;
      }
      else {
        local_40.y = (local_d8.Max.y - local_d8.Min.y) * local_a8 + local_d8.Min.y;
        local_38.y = local_98 + local_40.y;
        local_38.x = local_d8.Max.x;
        local_40.x = local_d8.Min.x;
      }
      ImDrawList::AddRectFilled
                (pIVar1->DrawList,&local_40,&local_38,(ImU32)local_dc,
                 (pIVar5->Style).ScrollbarRounding,0);
    }
  }
  else {
    local_de = false;
  }
  return local_de;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, ImS64* p_scroll_v, ImS64 size_avail_v, ImS64 size_contents_v, ImDrawFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_FLOOR((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_FLOOR((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const ImS64 win_size_v = ImMax(ImMax(size_contents_v, size_avail_v), (ImS64)1);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * ((float)size_avail_v / (float)win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    const ImS64 scroll_max = ImMax((ImS64)1, size_contents_v - size_avail_v);
    float scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        const float scrollbar_pos_v = bb.Min[axis];
        const float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            seek_absolute = (clicked_v_norm < grab_v_norm || clicked_v_norm > grab_v_norm + grab_h_norm);
            if (seek_absolute)
                g.ScrollbarClickDeltaToGrabCenter = 0.0f;
            else
                g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
        *p_scroll_v = (ImS64)(scroll_v_norm * scroll_max);

        // Update values for rendering
        scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, flags);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}